

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.c
# Opt level: O0

int my_fgetc(ALLEGRO_FILE *f)

{
  char cVar1;
  undefined8 in_RDI;
  char TestChar;
  int r;
  undefined4 local_c;
  
  if (my_ungetc_c == -1) {
    local_c = al_fgetc(in_RDI);
  }
  else {
    local_c = my_ungetc_c;
    my_ungetc_c = -1;
  }
  if ((local_c == 10) || (local_c == 0xd)) {
    cVar1 = '\n';
    if (local_c == 10) {
      cVar1 = '\r';
    }
    if (my_fgetc::LastChar == cVar1) {
      my_fgetc::LastChar = 0;
    }
    else {
      Lines = Lines + 1;
      my_fgetc::LastChar = local_c;
    }
  }
  else {
    my_fgetc::LastChar = local_c;
  }
  return local_c;
}

Assistant:

static int my_fgetc(ALLEGRO_FILE * f)
{
   static int LastChar = '\0';
   int r;
   char TestChar;

   if (my_ungetc_c != -1) {
      r = my_ungetc_c;
      my_ungetc_c = -1;
   }
   else
      r = al_fgetc(f);

   if (r == '\n' || r == '\r') {
      TestChar = (r == '\n') ? '\r' : '\n';

      if (LastChar != TestChar) {
         Lines++;
         LastChar = r;
      } else
         LastChar = '\0';
   } else
      LastChar = r;

   return r;
}